

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUtils.cpp
# Opt level: O0

SIMDValue Js::SIMDUtils::SIMDLdData(SIMDValue *data,uint8 dataWidth)

{
  code *pcVar1;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint8 dataWidth_local;
  SIMDValue *data_local;
  SIMDValue result;
  
  data_local._0_4_ = 0;
  data_local._4_4_ = 0;
  result.field_0.i32[0] = 0;
  result.field_0.i32[1] = 0;
  switch(dataWidth) {
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimdUtils.cpp"
                                ,0x52,"((0))","UNREACHED");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    break;
  case '\x10':
    result.field_0.i32[1] = (data->field_0).i32[3];
  case '\f':
    result.field_0.i32[0] = (data->field_0).i32[2];
  case '\b':
    data_local._4_4_ = (data->field_0).i32[1];
  case '\x04':
    data_local._0_4_ = (data->field_0).i32[0];
  }
  aVar2.i32[1] = data_local._4_4_;
  aVar2.i32[0] = (Type)data_local;
  aVar2.i32[2] = result.field_0.i32[0];
  aVar2.i32[3] = result.field_0.i32[1];
  return (SIMDValue)aVar2;
}

Assistant:

SIMDValue SIMDUtils::SIMDLdData(const SIMDValue *data, uint8 dataWidth)
    {
        SIMDValue result = { 0, 0, 0, 0 };
        // bitwise copy. Always use integer fields to avoid wrong copy of NaNs.
        switch (dataWidth)
        {
        case 16:
            result.i32[SIMD_W] = data->i32[SIMD_W];
            // fall through
        case 12:
            result.i32[SIMD_Z] = data->i32[SIMD_Z];
            // fall through
        case 8:
            result.i32[SIMD_Y] = data->i32[SIMD_Y];
            // fall through
        case 4:
            result.i32[SIMD_X] = data->i32[SIMD_X];
            break;
        default:
            Assert(UNREACHED);
        }
        return result;
    }